

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  bool bVar1;
  int iVar2;
  int out_size;
  void *out;
  int local_3c;
  void *local_38 [2];
  
  if (size < this->buffer_size_) {
    iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,local_38,&local_3c);
    if ((char)iVar2 != '\0') {
      do {
        if (size <= local_3c) {
          memcpy(local_38[0],data,(long)size);
          (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                    (this,(ulong)(uint)(local_3c - size));
          return true;
        }
        memcpy(local_38[0],data,(long)local_3c);
        data = (void *)((long)data + (long)local_3c);
        size = size - local_3c;
        iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                          (this,local_38,&local_3c);
      } while ((char)iVar2 != '\0');
    }
  }
  else {
    bVar1 = WriteBuffer(this);
    if ((bVar1) &&
       (iVar2 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar2 != '\0')) {
      if (this->buffer_used_ == 0) {
        this->position_ = this->position_ + (long)size;
        return true;
      }
      WriteAliasedRaw();
    }
  }
  return false;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      break;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}